

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_nested_loop_join.cpp
# Opt level: O1

bool duckdb::PhysicalNestedLoopJoin::IsSupported
               (vector<duckdb::JoinCondition,_true> *conditions,JoinType join_type)

{
  pointer pJVar1;
  pointer pEVar2;
  undefined3 in_register_00000031;
  vector<duckdb::JoinCondition,_true> *__range1;
  JoinCondition *cond;
  pointer this;
  bool bVar3;
  bool bVar4;
  
  bVar4 = true;
  if (CONCAT31(in_register_00000031,join_type) != 7) {
    pJVar1 = (conditions->
             super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
             super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (this = (conditions->
                super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
                super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                _M_impl.super__Vector_impl_data._M_start; bVar3 = this != pJVar1, bVar3;
        this = this + 1) {
      pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&this->left);
      if ((((pEVar2->return_type).physical_type_ == STRUCT) ||
          (pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(&this->left), (pEVar2->return_type).physical_type_ == LIST)) ||
         (pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(&this->left), (pEVar2->return_type).physical_type_ == ARRAY)) {
        if (bVar3) {
          return false;
        }
        break;
      }
    }
    if ((byte)(join_type - SEMI) < 2) {
      bVar4 = (long)(conditions->
                    super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
                    super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(conditions->
                    super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
                    super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x18;
    }
  }
  return bVar4;
}

Assistant:

bool PhysicalNestedLoopJoin::IsSupported(const vector<JoinCondition> &conditions, JoinType join_type) {
	if (join_type == JoinType::MARK) {
		return true;
	}
	for (auto &cond : conditions) {
		if (cond.left->return_type.InternalType() == PhysicalType::STRUCT ||
		    cond.left->return_type.InternalType() == PhysicalType::LIST ||
		    cond.left->return_type.InternalType() == PhysicalType::ARRAY) {
			return false;
		}
	}
	// To avoid situations like https://github.com/duckdb/duckdb/issues/10046
	// If there is an equality in the conditions, a hash join is planned
	// with one condition, we can use mark join logic, otherwise we should use physical blockwise nl join
	if (join_type == JoinType::SEMI || join_type == JoinType::ANTI) {
		return conditions.size() == 1;
	}
	return true;
}